

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_function_list.cpp
# Opt level: O0

bool __thiscall ON_FunctionList::CallFunctions(ON_FunctionList *this,bool bFirstToLast)

{
  bool bVar1;
  undefined8 *local_30;
  tagFunctionItem *item_1;
  tagFunctionItem *item;
  bool bFirstToLast_local;
  ON_FunctionList *this_local;
  
  bVar1 = ON_Lock::GetDefaultLock(&this->m_lock);
  if (bVar1) {
    if (bFirstToLast) {
      for (item_1 = (tagFunctionItem *)this->m_head; item_1 != (tagFunctionItem *)0x0;
          item_1 = item_1->m_next) {
        (*item_1->m_function)(item_1->m_function_parameter);
      }
    }
    else {
      for (local_30 = (undefined8 *)this->m_tail; local_30 != (undefined8 *)0x0;
          local_30 = (undefined8 *)*local_30) {
        (*(code *)local_30[2])(local_30[3]);
      }
    }
    ON_Lock::ReturnDefaultLock(&this->m_lock);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_FunctionList::CallFunctions(
  bool bFirstToLast
  )
{
  if ( false == m_lock.GetDefaultLock() )
    return false;

  if ( bFirstToLast )
  {
    for ( struct tagFunctionItem* item = (struct tagFunctionItem*)m_head; item; item = item->m_next )
    {
      item->m_function(item->m_function_parameter);
    }
  }
  else
  {
    for ( struct tagFunctionItem* item = (struct tagFunctionItem*)m_tail; item; item = item->m_prev )
    {
      item->m_function(item->m_function_parameter);
    }
  }
    
  m_lock.ReturnDefaultLock();

  return true;
}